

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O0

void __thiscall LinePrinter::LinePrinter(LinePrinter *this)

{
  int iVar1;
  char *pcVar2;
  bool local_aa;
  bool local_7c;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58;
  char *clicolor_force;
  byte local_3a;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *term;
  LinePrinter *this_local;
  
  this->have_blank_line_ = true;
  this->console_locked_ = false;
  term = &this->smart_terminal_;
  std::__cxx11::string::string((string *)&this->line_buffer_);
  std::__cxx11::string::string((string *)&this->output_buffer_);
  local_18 = getenv("TERM");
  iVar1 = isatty(1);
  pcVar2 = local_18;
  local_3a = 0;
  clicolor_force._3_1_ = 0;
  local_7c = false;
  if ((iVar1 != 0) && (local_7c = false, local_18 != (char *)0x0)) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar2,&local_39);
    clicolor_force._3_1_ = 1;
    local_7c = std::operator!=(&local_38,"dumb");
  }
  this->smart_terminal_ = local_7c;
  if ((clicolor_force._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator(&local_39);
  }
  this->supports_color_ = (bool)(this->smart_terminal_ & 1);
  if ((this->supports_color_ & 1U) == 0) {
    pcVar2 = getenv("CLICOLOR_FORCE");
    local_aa = false;
    local_58 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar2,&local_79);
      local_aa = std::operator!=(&local_78,"0");
    }
    this->supports_color_ = local_aa;
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
  }
  return;
}

Assistant:

LinePrinter::LinePrinter() : have_blank_line_(true), console_locked_(false) {
  const char* term = getenv("TERM");
#ifndef _WIN32
  smart_terminal_ = isatty(1) && term && string(term) != "dumb";
#else
  // Disable output buffer.  It'd be nice to use line buffering but
  // MSDN says: "For some systems, [_IOLBF] provides line
  // buffering. However, for Win32, the behavior is the same as _IOFBF
  // - Full Buffering."
  if (term && string(term) == "dumb") {
    smart_terminal_ = false;
  } else {
    setvbuf(stdout, NULL, _IONBF, 0);
    console_ = GetStdHandle(STD_OUTPUT_HANDLE);
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    smart_terminal_ = GetConsoleScreenBufferInfo(console_, &csbi);
  }
#endif
  supports_color_ = smart_terminal_;
  if (!supports_color_) {
    const char* clicolor_force = getenv("CLICOLOR_FORCE");
    supports_color_ = clicolor_force && string(clicolor_force) != "0";
  }
#ifdef _WIN32
  // Try enabling ANSI escape sequence support on Windows 10 terminals.
  if (supports_color_) {
    DWORD mode;
    if (GetConsoleMode(console_, &mode)) {
      if (!SetConsoleMode(console_, mode | ENABLE_VIRTUAL_TERMINAL_PROCESSING)) {
        supports_color_ = false;
      }
    }
  }
#endif
}